

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  int iVar1;
  ImGuiTable *pIVar2;
  int local_24;
  int i;
  ImGuiContext *g;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *ctx_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = ImPool<ImGuiTable>::GetSize(&ctx->Tables);
    if (local_24 == iVar1) break;
    pIVar2 = ImPool<ImGuiTable>::GetByIndex(&ctx->Tables,local_24);
    pIVar2->SettingsOffset = -1;
    local_24 = local_24 + 1;
  }
  ImChunkStream<ImGuiTableSettings>::clear(&ctx->SettingsTables);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}